

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::SphericalCamera::ToString_abi_cxx11_(string *__return_storage_ptr__,SphericalCamera *this)

{
  char **in_R8;
  undefined1 local_40 [8];
  string local_38;
  
  CameraBase::ToString_abi_cxx11_((string *)(local_40 + 8),&this->super_CameraBase);
  local_40 = (undefined1  [8])0x2c92f52;
  if (this->mapping == EquiRectangular) {
    local_40 = (undefined1  [8])0x2c92f42;
  }
  StringPrintf<std::__cxx11::string,char_const*>
            (__return_storage_ptr__,(pbrt *)"[ SphericalCamera %s mapping: %s ]",
             (char *)(local_40 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,in_R8);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string SphericalCamera::ToString() const {
    return StringPrintf("[ SphericalCamera %s mapping: %s ]", CameraBase::ToString(),
                        mapping == EquiRectangular ? "EquiRectangular" : "EqualArea");
}